

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::BVHNIntersector1<4,_1,_true,_embree::sse42::SubdivPatch1Intersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 uVar10;
  Geometry *pGVar11;
  RTCRayQueryContext *pRVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 (*pauVar17) [16];
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  float *pfVar22;
  RayHit *pRVar23;
  int iVar24;
  long lVar25;
  undefined1 auVar26 [8];
  Geometry *pGVar27;
  undefined1 auVar28 [8];
  undefined4 uVar29;
  ulong unaff_RBX;
  ulong uVar30;
  undefined8 uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  float fVar35;
  float fVar36;
  float fVar55;
  float fVar57;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar56;
  float fVar58;
  float fVar59;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar60;
  float fVar73;
  float fVar74;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar75;
  float fVar84;
  float fVar85;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar86;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  float fVar101;
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  float fVar109;
  undefined1 auVar104 [16];
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar105 [16];
  uint uVar111;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar120;
  float fVar121;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar122;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar123 [12];
  undefined1 auVar124 [12];
  float fVar133;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar134;
  float fVar135;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar186;
  float fVar187;
  undefined1 auVar184 [16];
  float fVar188;
  undefined1 auVar185 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MapUV<embree::sse42::GridSOA::Gather2x3> mapUV;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_124c [4];
  undefined1 local_1248 [8];
  float fStack_1240;
  float fStack_123c;
  ulong local_1230;
  undefined8 local_1228;
  float fStack_1220;
  anon_union_12_2_4062524c_for_Vec3<float>_1 aStack_121c;
  float local_120c;
  undefined1 local_1208 [8];
  float fStack_1200;
  float fStack_11fc;
  undefined8 local_11f8;
  float fStack_11f0;
  float fStack_11ec;
  undefined8 local_11e8;
  float fStack_11e0;
  float fStack_11dc;
  undefined1 local_11d8 [16];
  RTCFilterFunctionNArguments local_11c8;
  undefined1 local_1198 [8];
  float fStack_1190;
  float fStack_118c;
  undefined8 local_1188;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  undefined4 local_1174;
  undefined4 local_1170;
  float local_116c;
  float local_1168;
  float local_1164;
  undefined4 local_1160;
  uint local_115c;
  uint local_1158;
  undefined1 (*local_1140) [16];
  ulong local_1138;
  ulong local_1130;
  undefined1 local_1128 [16];
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined1 (**local_10f8) [16];
  undefined1 local_10e8 [16];
  float local_10d8 [4];
  float local_10c8 [4];
  float local_10b8 [4];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined8 local_1078;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [8];
  undefined8 uStack_1030;
  undefined1 local_1028 [8];
  undefined8 uStack_1020;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  float fVar132;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      uVar31 = local_f68;
      fVar35 = (ray->super_RayK<1>).org.field_0.m128[0];
      fVar59 = (ray->super_RayK<1>).org.field_0.m128[1];
      fVar109 = (ray->super_RayK<1>).org.field_0.m128[2];
      aVar7 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar163 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar57 = 0.0;
      if (0.0 <= fVar163) {
        fVar57 = fVar163;
      }
      auVar154._4_4_ = -(uint)(ABS(aVar7.y) < 1e-18);
      auVar154._0_4_ = -(uint)(ABS(aVar7.x) < 1e-18);
      auVar154._8_4_ = -(uint)(ABS(aVar7.z) < 1e-18);
      auVar154._12_4_ = -(uint)(ABS(aVar7.field_3.w) < 1e-18);
      auVar153 = divps(_DAT_01feca10,(undefined1  [16])aVar7);
      auVar154 = blendvps(auVar153,_DAT_0201c930,auVar154);
      fVar163 = (ray->super_RayK<1>).tfar;
      fVar74 = 0.0;
      if (0.0 <= fVar163) {
        fVar74 = fVar163;
      }
      fVar161 = auVar154._0_4_ * 0.99999964;
      fVar162 = auVar154._4_4_ * 0.99999964;
      fVar163 = auVar154._8_4_ * 0.99999964;
      fVar150 = auVar154._0_4_ * 1.0000004;
      fVar155 = auVar154._4_4_ * 1.0000004;
      fVar158 = auVar154._8_4_ * 1.0000004;
      uVar30 = (ulong)(fVar161 < 0.0) * 0x10;
      uVar32 = (ulong)(fVar162 < 0.0) << 4 | 0x20;
      uVar34 = (ulong)(fVar163 < 0.0) << 4 | 0x40;
      auVar153._4_4_ = fVar57;
      auVar153._0_4_ = fVar57;
      auVar153._8_4_ = fVar57;
      auVar153._12_4_ = fVar57;
      auVar175._4_4_ = fVar74;
      auVar175._0_4_ = fVar74;
      auVar175._8_4_ = fVar74;
      auVar175._12_4_ = fVar74;
      _local_f88 = mm_lookupmask_ps._240_8_;
      _uStack_f80 = mm_lookupmask_ps._248_8_;
      local_1230 = 0;
      local_1068 = fVar109;
      fStack_1064 = fVar109;
      fStack_1060 = fVar109;
      fStack_105c = fVar109;
      local_f98 = auVar153;
      local_fa8 = fVar158;
      fStack_fa4 = fVar158;
      fStack_fa0 = fVar158;
      fStack_f9c = fVar158;
      local_fb8 = fVar163;
      fStack_fb4 = fVar163;
      fStack_fb0 = fVar163;
      fStack_fac = fVar163;
      local_fc8 = fVar35;
      fStack_fc4 = fVar35;
      fStack_fc0 = fVar35;
      fStack_fbc = fVar35;
      local_fd8 = fVar59;
      fStack_fd4 = fVar59;
      fStack_fd0 = fVar59;
      fStack_fcc = fVar59;
      local_fe8 = fVar161;
      fStack_fe4 = fVar161;
      fStack_fe0 = fVar161;
      fStack_fdc = fVar161;
      local_ff8 = fVar162;
      fStack_ff4 = fVar162;
      fStack_ff0 = fVar162;
      fStack_fec = fVar162;
      local_1008 = fVar150;
      fStack_1004 = fVar150;
      fStack_1000 = fVar150;
      fStack_ffc = fVar150;
      local_1058 = fVar155;
      fStack_1054 = fVar155;
      fStack_1050 = fVar155;
      fStack_104c = fVar155;
      fVar57 = fVar163;
      fVar74 = fVar163;
      fVar114 = fVar163;
      fVar138 = fVar162;
      fVar181 = fVar162;
      fVar182 = fVar162;
      fVar142 = fVar109;
      fVar36 = fVar109;
      fVar56 = fVar109;
      fVar58 = fVar155;
      fVar133 = fVar155;
      fVar55 = fVar155;
      fVar60 = fVar158;
      fVar73 = fVar158;
      fVar75 = fVar158;
      fVar84 = fVar35;
      fVar85 = fVar35;
      fVar86 = fVar35;
      fVar100 = fVar59;
      fVar101 = fVar59;
      fVar110 = fVar59;
      fVar112 = fVar161;
      fVar113 = fVar161;
      fVar115 = fVar161;
      fVar120 = fVar150;
      fVar121 = fVar150;
      fVar122 = fVar150;
      do {
        do {
          do {
            if ((undefined1 (*) [16])uVar31 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar17 = (undefined1 (*) [16])(uVar31 + -0x10);
            uVar31 = uVar31 + -0x10;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar17 + 8));
          uVar21 = *(ulong *)*(undefined1 (*) [16])uVar31;
          do {
            if ((uVar21 & 8) == 0) {
              pfVar6 = (float *)(uVar21 + 0x20 + uVar30);
              auVar76._0_4_ = (*pfVar6 - fVar35) * fVar161;
              auVar76._4_4_ = (pfVar6[1] - fVar84) * fVar112;
              auVar76._8_4_ = (pfVar6[2] - fVar85) * fVar113;
              auVar76._12_4_ = (pfVar6[3] - fVar86) * fVar115;
              pfVar6 = (float *)(uVar21 + 0x20 + uVar32);
              auVar129._0_4_ = (*pfVar6 - fVar59) * fVar162;
              auVar129._4_4_ = (pfVar6[1] - fVar100) * fVar138;
              auVar129._8_4_ = (pfVar6[2] - fVar101) * fVar181;
              auVar129._12_4_ = (pfVar6[3] - fVar110) * fVar182;
              auVar154 = maxps(auVar76,auVar129);
              pfVar6 = (float *)(uVar21 + 0x20 + uVar34);
              auVar126._0_4_ = (*pfVar6 - fVar109) * fVar163;
              auVar126._4_4_ = (pfVar6[1] - fVar142) * fVar57;
              auVar126._8_4_ = (pfVar6[2] - fVar36) * fVar74;
              auVar126._12_4_ = (pfVar6[3] - fVar56) * fVar114;
              auVar76 = maxps(auVar126,auVar153);
              local_1128 = maxps(auVar154,auVar76);
              pfVar6 = (float *)(uVar21 + 0x20 + (uVar30 ^ 0x10));
              auVar77._0_4_ = (*pfVar6 - fVar35) * fVar150;
              auVar77._4_4_ = (pfVar6[1] - fVar84) * fVar120;
              auVar77._8_4_ = (pfVar6[2] - fVar85) * fVar121;
              auVar77._12_4_ = (pfVar6[3] - fVar86) * fVar122;
              pfVar6 = (float *)(uVar21 + 0x20 + (uVar32 ^ 0x10));
              auVar87._0_4_ = (*pfVar6 - fVar59) * fVar155;
              auVar87._4_4_ = (pfVar6[1] - fVar100) * fVar58;
              auVar87._8_4_ = (pfVar6[2] - fVar101) * fVar133;
              auVar87._12_4_ = (pfVar6[3] - fVar110) * fVar55;
              auVar154 = minps(auVar77,auVar87);
              pfVar6 = (float *)(uVar21 + 0x20 + (uVar34 ^ 0x10));
              auVar88._0_4_ = (*pfVar6 - fVar109) * fVar158;
              auVar88._4_4_ = (pfVar6[1] - fVar142) * fVar60;
              auVar88._8_4_ = (pfVar6[2] - fVar36) * fVar73;
              auVar88._12_4_ = (pfVar6[3] - fVar56) * fVar75;
              auVar76 = minps(auVar88,auVar175);
              auVar154 = minps(auVar154,auVar76);
              auVar81._4_4_ = -(uint)(local_1128._4_4_ <= auVar154._4_4_);
              auVar81._0_4_ = -(uint)(local_1128._0_4_ <= auVar154._0_4_);
              auVar81._8_4_ = -(uint)(local_1128._8_4_ <= auVar154._8_4_);
              auVar81._12_4_ = -(uint)(local_1128._12_4_ <= auVar154._12_4_);
              uVar29 = movmskps((int)unaff_RBX,auVar81);
              unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar29);
            }
            if ((uVar21 & 8) == 0) {
              if (unaff_RBX == 0) {
                iVar18 = 4;
              }
              else {
                uVar20 = uVar21 & 0xfffffffffffffff0;
                lVar25 = 0;
                if (unaff_RBX != 0) {
                  for (; (unaff_RBX >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                  }
                }
                iVar18 = 0;
                uVar21 = *(ulong *)(uVar20 + lVar25 * 8);
                uVar33 = unaff_RBX - 1 & unaff_RBX;
                if (uVar33 != 0) {
                  uVar8 = *(uint *)(local_1128 + lVar25 * 4);
                  lVar25 = 0;
                  if (uVar33 != 0) {
                    for (; (uVar33 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                    }
                  }
                  uVar9 = *(ulong *)(uVar20 + lVar25 * 8);
                  uVar19 = *(uint *)(local_1128 + lVar25 * 4);
                  uVar33 = uVar33 - 1 & uVar33;
                  if (uVar33 == 0) {
                    if (uVar8 < uVar19) {
                      *(ulong *)*(undefined1 (*) [16])uVar31 = uVar9;
                      *(uint *)((long)*(undefined1 (*) [16])uVar31 + 8) = uVar19;
                      uVar31 = (undefined1 (*) [16])(uVar31 + 0x10);
                    }
                    else {
                      *(ulong *)*(undefined1 (*) [16])uVar31 = uVar21;
                      *(uint *)((long)*(undefined1 (*) [16])uVar31 + 8) = uVar8;
                      uVar21 = uVar9;
                      uVar31 = (undefined1 (*) [16])(uVar31 + 0x10);
                    }
                  }
                  else {
                    auVar78._8_4_ = uVar8;
                    auVar78._0_8_ = uVar21;
                    auVar78._12_4_ = 0;
                    auVar116._8_4_ = uVar19;
                    auVar116._0_8_ = uVar9;
                    auVar116._12_4_ = 0;
                    lVar25 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                      }
                    }
                    uVar10 = *(undefined8 *)(uVar20 + lVar25 * 8);
                    iVar24 = *(int *)(local_1128 + lVar25 * 4);
                    auVar89._8_4_ = iVar24;
                    auVar89._0_8_ = uVar10;
                    auVar89._12_4_ = 0;
                    auVar37._8_4_ = -(uint)((int)uVar8 < (int)uVar19);
                    uVar33 = uVar33 - 1 & uVar33;
                    fVar142 = fStack_1064;
                    fVar36 = fStack_1060;
                    fVar56 = fStack_105c;
                    fVar109 = local_1068;
                    if (uVar33 == 0) {
                      auVar37._4_4_ = auVar37._8_4_;
                      auVar37._0_4_ = auVar37._8_4_;
                      auVar37._12_4_ = auVar37._8_4_;
                      auVar104._8_4_ = uVar19;
                      auVar104._0_8_ = uVar9;
                      auVar104._12_4_ = 0;
                      auVar76 = blendvps(auVar104,auVar78,auVar37);
                      auVar154 = blendvps(auVar78,auVar116,auVar37);
                      auVar38._8_4_ = -(uint)(auVar76._8_4_ < iVar24);
                      auVar38._4_4_ = auVar38._8_4_;
                      auVar38._0_4_ = auVar38._8_4_;
                      auVar38._12_4_ = auVar38._8_4_;
                      auVar117._8_4_ = iVar24;
                      auVar117._0_8_ = uVar10;
                      auVar117._12_4_ = 0;
                      auVar129 = blendvps(auVar117,auVar76,auVar38);
                      auVar81 = blendvps(auVar76,auVar89,auVar38);
                      auVar39._8_4_ = -(uint)(auVar154._8_4_ < auVar81._8_4_);
                      auVar39._4_4_ = auVar39._8_4_;
                      auVar39._0_4_ = auVar39._8_4_;
                      auVar39._12_4_ = auVar39._8_4_;
                      auVar76 = blendvps(auVar81,auVar154,auVar39);
                      auVar154 = blendvps(auVar154,auVar81,auVar39);
                      *(undefined1 (*) [16])uVar31 = auVar154;
                      *(undefined1 (*) [16])(uVar31 + 0x10) = auVar76;
                      uVar21 = auVar129._0_8_;
                      uVar31 = (undefined1 (*) [16])(uVar31 + 0x20);
                    }
                    else {
                      lVar25 = 0;
                      if (uVar33 != 0) {
                        for (; (uVar33 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                        }
                      }
                      auVar40._4_4_ = auVar37._8_4_;
                      auVar40._0_4_ = auVar37._8_4_;
                      auVar40._8_4_ = auVar37._8_4_;
                      auVar40._12_4_ = auVar37._8_4_;
                      auVar81 = blendvps(auVar116,auVar78,auVar40);
                      auVar154 = blendvps(auVar78,auVar116,auVar40);
                      auVar125._8_4_ = *(int *)(local_1128 + lVar25 * 4);
                      auVar125._0_8_ = *(undefined8 *)(uVar20 + lVar25 * 8);
                      auVar125._12_4_ = 0;
                      auVar41._8_4_ = -(uint)(iVar24 < *(int *)(local_1128 + lVar25 * 4));
                      auVar41._4_4_ = auVar41._8_4_;
                      auVar41._0_4_ = auVar41._8_4_;
                      auVar41._12_4_ = auVar41._8_4_;
                      auVar129 = blendvps(auVar125,auVar89,auVar41);
                      auVar76 = blendvps(auVar89,auVar125,auVar41);
                      auVar42._8_4_ = -(uint)(auVar154._8_4_ < auVar76._8_4_);
                      auVar42._4_4_ = auVar42._8_4_;
                      auVar42._0_4_ = auVar42._8_4_;
                      auVar42._12_4_ = auVar42._8_4_;
                      auVar126 = blendvps(auVar76,auVar154,auVar42);
                      auVar154 = blendvps(auVar154,auVar76,auVar42);
                      auVar43._8_4_ = -(uint)(auVar81._8_4_ < auVar129._8_4_);
                      auVar43._4_4_ = auVar43._8_4_;
                      auVar43._0_4_ = auVar43._8_4_;
                      auVar43._12_4_ = auVar43._8_4_;
                      auVar76 = blendvps(auVar129,auVar81,auVar43);
                      auVar81 = blendvps(auVar81,auVar129,auVar43);
                      auVar44._8_4_ = -(uint)(auVar81._8_4_ < auVar126._8_4_);
                      auVar44._4_4_ = auVar44._8_4_;
                      auVar44._0_4_ = auVar44._8_4_;
                      auVar44._12_4_ = auVar44._8_4_;
                      auVar129 = blendvps(auVar126,auVar81,auVar44);
                      auVar81 = blendvps(auVar81,auVar126,auVar44);
                      *(undefined1 (*) [16])uVar31 = auVar154;
                      *(undefined1 (*) [16])(uVar31 + 0x10) = auVar81;
                      *(undefined1 (*) [16])(uVar31 + 0x20) = auVar129;
                      uVar21 = auVar76._0_8_;
                      uVar31 = (undefined1 (*) [16])(uVar31 + 0x30);
                      fVar155 = local_1058;
                      fVar58 = fStack_1054;
                      fVar133 = fStack_1050;
                      fVar55 = fStack_104c;
                    }
                  }
                }
              }
            }
            else {
              iVar18 = 6;
            }
          } while (iVar18 == 0);
        } while (iVar18 != 6);
        if (((uint)uVar21 & 0xf) == 8) {
          uVar20 = (ulong)*(uint *)(local_1230 + 0xc);
          auVar28 = (undefined1  [8])(*(uint *)(local_1230 + 0x24) + local_1230 + (uVar21 >> 4) * 4)
          ;
          fVar163 = *(float *)((long)auVar28 + 0x30);
          pfVar6 = (float *)((long)auVar28 + 0x2c + uVar20 * 4);
          fVar57 = pfVar6[1];
          fVar35 = *(float *)((long)auVar28 + 0x34);
          fVar59 = pfVar6[2];
          if (uVar20 == 2) {
            fVar35 = fVar163;
            fVar59 = fVar57;
          }
          uVar21 = (ulong)*(uint *)(local_1230 + 0x14);
          lVar25 = (long)auVar28 + uVar21 * 4;
          fVar109 = *(float *)(lVar25 + 0x30);
          pfVar22 = (float *)(lVar25 + 0x2c) + uVar20;
          fVar74 = pfVar22[1];
          fVar114 = *(float *)(lVar25 + 0x34);
          fVar162 = pfVar22[2];
          if (uVar20 == 2) {
            fVar114 = fVar109;
            fVar162 = fVar74;
          }
          lVar1 = (long)auVar28 + uVar21 * 8;
          fVar138 = *(float *)(lVar1 + 0x30);
          pfVar2 = (float *)(lVar1 + 0x2c) + uVar20;
          fVar181 = pfVar2[1];
          fVar182 = pfVar2[2];
          fVar142 = *(float *)(lVar1 + 0x34);
          if (uVar20 == 2) {
            fVar182 = fVar181;
            fVar142 = fVar138;
          }
          fVar36 = (ray->super_RayK<1>).org.field_0.m128[0];
          fVar56 = (ray->super_RayK<1>).org.field_0.m128[1];
          fVar58 = (ray->super_RayK<1>).org.field_0.m128[2];
          fVar133 = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_1248._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_11f8._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          fVar164 = *(float *)((long)auVar28 + 0x2c) - fVar36;
          fVar168 = *pfVar6 - fVar36;
          fStack_1180 = fVar163 - fVar36;
          fStack_117c = fVar57 - fVar36;
          local_1198._0_4_ = *(float *)(lVar25 + 0x2c) - fVar56;
          local_1198._4_4_ = *pfVar22 - fVar56;
          fStack_1190 = fVar109 - fVar56;
          fStack_118c = fVar74 - fVar56;
          local_11e8._0_4_ = *(float *)(lVar1 + 0x2c) - fVar58;
          local_11e8._4_4_ = *pfVar2 - fVar58;
          fStack_11e0 = fVar138 - fVar58;
          fStack_11dc = fVar181 - fVar58;
          fVar75 = fVar163 - fVar36;
          fVar163 = fVar163 - fVar36;
          fStack_1220 = fVar35 - fVar36;
          aStack_121c.field_0.x = fVar35 - fVar36;
          fVar100 = fVar109 - fVar56;
          fVar109 = fVar109 - fVar56;
          fVar112 = fVar114 - fVar56;
          fVar114 = fVar114 - fVar56;
          fVar134 = fVar138 - fVar58;
          fVar138 = fVar138 - fVar58;
          fVar140 = fVar142 - fVar58;
          fVar142 = fVar142 - fVar58;
          fVar35 = *pfVar6 - fVar36;
          fVar55 = fVar57 - fVar36;
          fVar57 = fVar57 - fVar36;
          fVar59 = fVar59 - fVar36;
          fVar60 = *pfVar22 - fVar56;
          fVar73 = fVar74 - fVar56;
          fVar74 = fVar74 - fVar56;
          fVar162 = fVar162 - fVar56;
          fVar179 = *pfVar2 - fVar58;
          fVar180 = fVar181 - fVar58;
          fVar181 = fVar181 - fVar58;
          fVar182 = fVar182 - fVar58;
          local_1208._0_4_ = fVar35 - fVar164;
          local_1208._4_4_ = fVar55 - fVar168;
          fStack_1200 = fVar57 - fStack_1180;
          fStack_11fc = fVar59 - fStack_117c;
          local_1018 = fVar60 - (float)local_1198._0_4_;
          fStack_1014 = fVar73 - (float)local_1198._4_4_;
          fStack_1010 = fVar74 - fStack_1190;
          fStack_100c = fVar162 - fStack_118c;
          fVar151 = fVar179 - (float)local_11e8;
          fVar156 = fVar180 - local_11e8._4_4_;
          fStack_1070 = fVar181 - fStack_11e0;
          fStack_106c = fVar182 - fStack_11dc;
          local_1078 = (RTCRayQueryContext *)CONCAT44(fVar156,fVar151);
          local_11f8._0_4_ = local_11f8._4_4_;
          fStack_11f0 = local_11f8._4_4_;
          fStack_11ec = local_11f8._4_4_;
          fVar36 = (float)local_1198._0_4_ - fVar100;
          fVar56 = (float)local_1198._4_4_ - fVar109;
          fVar58 = fStack_1190 - fVar112;
          fVar155 = fStack_118c - fVar114;
          fVar158 = (local_1018 * (fVar179 + (float)local_11e8) -
                    fVar151 * (fVar60 + (float)local_1198._0_4_)) * fVar133 +
                    (fVar151 * (fVar35 + fVar164) -
                    (fVar179 + (float)local_11e8) * (float)local_1208._0_4_) *
                    (float)local_1248._4_4_ +
                    ((fVar60 + (float)local_1198._0_4_) * (float)local_1208._0_4_ -
                    (fVar35 + fVar164) * local_1018) * local_11f8._4_4_;
          fVar84 = (fStack_1014 * (fVar180 + local_11e8._4_4_) -
                   fVar156 * (fVar73 + (float)local_1198._4_4_)) * fVar133 +
                   (fVar156 * (fVar55 + fVar168) -
                   (fVar180 + local_11e8._4_4_) * (float)local_1208._4_4_) * (float)local_1248._4_4_
                   + ((fVar73 + (float)local_1198._4_4_) * (float)local_1208._4_4_ -
                     (fVar55 + fVar168) * fStack_1014) * local_11f8._4_4_;
          local_1128._0_8_ = CONCAT44(fVar84,fVar158);
          fVar85 = (fStack_1010 * (fVar181 + fStack_11e0) - fStack_1070 * (fVar74 + fStack_1190)) *
                   fVar133 + (fStack_1070 * (fVar57 + fStack_1180) -
                             (fVar181 + fStack_11e0) * fStack_1200) * (float)local_1248._4_4_ +
                             ((fVar74 + fStack_1190) * fStack_1200 -
                             (fVar57 + fStack_1180) * fStack_1010) * local_11f8._4_4_;
          fVar86 = (fStack_100c * (fVar182 + fStack_11dc) - fStack_106c * (fVar162 + fStack_118c)) *
                   fVar133 + (fStack_106c * (fVar59 + fStack_117c) -
                             (fVar182 + fStack_11dc) * fStack_11fc) * (float)local_1248._4_4_ +
                             ((fVar162 + fStack_118c) * fStack_11fc -
                             (fVar59 + fStack_117c) * fStack_100c) * local_11f8._4_4_;
          fVar101 = (float)local_11e8 - fVar134;
          fVar110 = local_11e8._4_4_ - fVar138;
          fVar113 = fStack_11e0 - fVar140;
          fVar115 = fStack_11dc - fVar142;
          fVar165 = fVar164 - fVar75;
          fVar169 = fVar168 - fVar163;
          fVar170 = fStack_1180 - fStack_1220;
          fVar171 = fStack_117c - aStack_121c.field_0.x;
          local_1188 = CONCAT44(fVar168,fVar164);
          fVar150 = (fVar36 * ((float)local_11e8 + fVar134) -
                    fVar101 * ((float)local_1198._0_4_ + fVar100)) * fVar133 +
                    (fVar101 * (fVar164 + fVar75) - ((float)local_11e8 + fVar134) * fVar165) *
                    (float)local_1248._4_4_ +
                    (((float)local_1198._0_4_ + fVar100) * fVar165 - (fVar164 + fVar75) * fVar36) *
                    local_11f8._4_4_;
          fVar132 = (fVar56 * (local_11e8._4_4_ + fVar138) -
                    fVar110 * ((float)local_1198._4_4_ + fVar109)) * fVar133 +
                    (fVar110 * (fVar168 + fVar163) - (local_11e8._4_4_ + fVar138) * fVar169) *
                    (float)local_1248._4_4_ +
                    (((float)local_1198._4_4_ + fVar109) * fVar169 - (fVar168 + fVar163) * fVar56) *
                    local_11f8._4_4_;
          auVar127._0_8_ = CONCAT44(fVar132,fVar150);
          auVar127._8_4_ =
               (fVar58 * (fStack_11e0 + fVar140) - fVar113 * (fStack_1190 + fVar112)) * fVar133 +
               (fVar113 * (fStack_1180 + fStack_1220) - (fStack_11e0 + fVar140) * fVar170) *
               (float)local_1248._4_4_ +
               ((fStack_1190 + fVar112) * fVar170 - (fStack_1180 + fStack_1220) * fVar58) *
               local_11f8._4_4_;
          auVar127._12_4_ =
               (fVar155 * (fStack_11dc + fVar142) - fVar115 * (fStack_118c + fVar114)) * fVar133 +
               (fVar115 * (fStack_117c + aStack_121c.field_0.x) - (fStack_11dc + fVar142) * fVar171)
               * (float)local_1248._4_4_ +
               ((fStack_118c + fVar114) * fVar171 - (fStack_117c + aStack_121c.field_0.x) * fVar155)
               * local_11f8._4_4_;
          fVar152 = fVar75 - fVar35;
          fVar157 = fVar163 - fVar55;
          fVar159 = fStack_1220 - fVar57;
          fVar160 = aStack_121c.field_0.x - fVar59;
          fVar135 = fVar100 - fVar60;
          fVar139 = fVar109 - fVar73;
          fVar141 = fVar112 - fVar74;
          fVar143 = fVar114 - fVar162;
          fVar161 = fVar134 - fVar179;
          fVar120 = fVar138 - fVar180;
          fVar121 = fVar140 - fVar181;
          fVar122 = fVar142 - fVar182;
          local_1248._0_4_ = local_1248._4_4_;
          fStack_1240 = (float)local_1248._4_4_;
          fStack_123c = (float)local_1248._4_4_;
          auVar79._0_4_ =
               (fVar135 * (fVar179 + fVar134) - fVar161 * (fVar60 + fVar100)) * fVar133 +
               (fVar161 * (fVar35 + fVar75) - (fVar179 + fVar134) * fVar152) *
               (float)local_1248._4_4_ +
               ((fVar60 + fVar100) * fVar152 - (fVar35 + fVar75) * fVar135) * local_11f8._4_4_;
          auVar79._4_4_ =
               (fVar139 * (fVar180 + fVar138) - fVar120 * (fVar73 + fVar109)) * fVar133 +
               (fVar120 * (fVar55 + fVar163) - (fVar180 + fVar138) * fVar157) *
               (float)local_1248._4_4_ +
               ((fVar73 + fVar109) * fVar157 - (fVar55 + fVar163) * fVar139) * local_11f8._4_4_;
          auVar79._8_4_ =
               (fVar141 * (fVar181 + fVar140) - fVar121 * (fVar74 + fVar112)) * fVar133 +
               (fVar121 * (fVar57 + fStack_1220) - (fVar181 + fVar140) * fVar159) *
               (float)local_1248._4_4_ +
               ((fVar74 + fVar112) * fVar159 - (fVar57 + fStack_1220) * fVar141) * local_11f8._4_4_;
          auVar79._12_4_ =
               (fVar143 * (fVar182 + fVar142) - fVar122 * (fVar162 + fVar114)) * fVar133 +
               (fVar122 * (fVar59 + aStack_121c.field_0.x) - (fVar182 + fVar142) * fVar160) *
               (float)local_1248._4_4_ +
               ((fVar162 + fVar114) * fVar160 - (fVar59 + aStack_121c.field_0.x) * fVar143) *
               local_11f8._4_4_;
          local_1038._0_4_ = fVar158 + fVar150 + auVar79._0_4_;
          local_1038._4_4_ = fVar84 + fVar132 + auVar79._4_4_;
          fVar163 = fVar85 + auVar127._8_4_ + auVar79._8_4_;
          fVar57 = fVar86 + auVar127._12_4_ + auVar79._12_4_;
          auVar45._8_4_ = fVar85;
          auVar45._0_8_ = local_1128._0_8_;
          auVar45._12_4_ = fVar86;
          auVar154 = minps(auVar45,auVar127);
          auVar153 = minps(auVar154,auVar79);
          uStack_1020._0_4_ = fVar85;
          local_1028 = (undefined1  [8])local_1128._0_8_;
          uStack_1020._4_4_ = fVar86;
          auVar154 = _local_1028;
          auVar174._8_4_ = fVar85;
          auVar174._0_8_ = local_1128._0_8_;
          auVar174._12_4_ = fVar86;
          local_1048 = auVar127;
          auVar175 = maxps(auVar174,auVar127);
          auVar175 = maxps(auVar175,auVar79);
          uStack_1030._0_4_ = fVar163;
          uStack_1030._4_4_ = fVar57;
          local_1130 = (ulong)*(uint *)(local_1230 + 0x10);
          local_1140 = (undefined1 (*) [16])((long)auVar28 + 0x2c + uVar21 * 0xc);
          local_1138 = uVar20;
          uVar8 = *(uint *)(local_1230 + 0x18);
          local_1228 = (Geometry *)(ulong)uVar8;
          local_120c = *(float *)(local_1230 + 0x1c);
          local_10f8 = &local_1140;
          auVar176._0_4_ =
               -(uint)(auVar175._0_4_ <= ABS((float)local_1038._0_4_) * 1.1920929e-07 ||
                      -(ABS((float)local_1038._0_4_) * 1.1920929e-07) <= auVar153._0_4_) & local_f88
          ;
          auVar176._4_4_ =
               -(uint)(auVar175._4_4_ <= ABS((float)local_1038._4_4_) * 1.1920929e-07 ||
                      -(ABS((float)local_1038._4_4_) * 1.1920929e-07) <= auVar153._4_4_) &
               uStack_f84;
          auVar176._8_4_ =
               -(uint)(auVar175._8_4_ <= ABS(fVar163) * 1.1920929e-07 ||
                      -(ABS(fVar163) * 1.1920929e-07) <= auVar153._8_4_) & uStack_f80;
          auVar176._12_4_ =
               -(uint)(auVar175._12_4_ <= ABS(fVar57) * 1.1920929e-07 ||
                      -(ABS(fVar57) * 1.1920929e-07) <= auVar153._12_4_) & uStack_f7c;
          iVar18 = movmskps((int)&local_1140,auVar176);
          uVar21 = local_1130;
          if (iVar18 != 0) {
            auVar136._0_4_ = local_1018 * fVar101 - fVar151 * fVar36;
            auVar136._4_4_ = fStack_1014 * fVar110 - fVar156 * fVar56;
            auVar136._8_4_ = fStack_1010 * fVar113 - fStack_1070 * fVar58;
            auVar136._12_4_ = fStack_100c * fVar115 - fStack_106c * fVar155;
            auVar172._0_4_ = fVar36 * fVar161 - fVar101 * fVar135;
            auVar172._4_4_ = fVar56 * fVar120 - fVar110 * fVar139;
            auVar172._8_4_ = fVar58 * fVar121 - fVar113 * fVar141;
            auVar172._12_4_ = fVar155 * fVar122 - fVar115 * fVar143;
            auVar46._4_4_ = -(uint)(ABS(fVar156 * fVar56) < ABS(fVar110 * fVar139));
            auVar46._0_4_ = -(uint)(ABS(fVar151 * fVar36) < ABS(fVar101 * fVar135));
            auVar46._8_4_ = -(uint)(ABS(fStack_1070 * fVar58) < ABS(fVar113 * fVar141));
            auVar46._12_4_ = -(uint)(ABS(fStack_106c * fVar155) < ABS(fVar115 * fVar143));
            local_10a8 = blendvps(auVar172,auVar136,auVar46);
            auVar184._0_4_ = fVar101 * fVar152 - fVar165 * fVar161;
            auVar184._4_4_ = fVar110 * fVar157 - fVar169 * fVar120;
            auVar184._8_4_ = fVar113 * fVar159 - fVar170 * fVar121;
            auVar184._12_4_ = fVar115 * fVar160 - fVar171 * fVar122;
            auVar47._4_4_ = -(uint)(ABS((float)local_1208._4_4_ * fVar110) < ABS(fVar169 * fVar120))
            ;
            auVar47._0_4_ = -(uint)(ABS((float)local_1208._0_4_ * fVar101) < ABS(fVar165 * fVar161))
            ;
            auVar47._8_4_ = -(uint)(ABS(fStack_1200 * fVar113) < ABS(fVar170 * fVar121));
            auVar47._12_4_ = -(uint)(ABS(fStack_11fc * fVar115) < ABS(fVar171 * fVar122));
            auVar13._4_4_ = fVar156 * fVar169 - (float)local_1208._4_4_ * fVar110;
            auVar13._0_4_ = fVar151 * fVar165 - (float)local_1208._0_4_ * fVar101;
            auVar13._8_4_ = fStack_1070 * fVar170 - fStack_1200 * fVar113;
            auVar13._12_4_ = fStack_106c * fVar171 - fStack_11fc * fVar115;
            local_1098 = blendvps(auVar184,auVar13,auVar47);
            auVar105._0_4_ = (float)local_1208._0_4_ * fVar36 - local_1018 * fVar165;
            auVar105._4_4_ = (float)local_1208._4_4_ * fVar56 - fStack_1014 * fVar169;
            auVar105._8_4_ = fStack_1200 * fVar58 - fStack_1010 * fVar170;
            auVar105._12_4_ = fStack_11fc * fVar155 - fStack_100c * fVar171;
            auVar166._0_4_ = fVar165 * fVar135 - fVar36 * fVar152;
            auVar166._4_4_ = fVar169 * fVar139 - fVar56 * fVar157;
            auVar166._8_4_ = fVar170 * fVar141 - fVar58 * fVar159;
            auVar166._12_4_ = fVar171 * fVar143 - fVar155 * fVar160;
            auVar48._4_4_ = -(uint)(ABS(fStack_1014 * fVar169) < ABS(fVar56 * fVar157));
            auVar48._0_4_ = -(uint)(ABS(local_1018 * fVar165) < ABS(fVar36 * fVar152));
            auVar48._8_4_ = -(uint)(ABS(fStack_1010 * fVar170) < ABS(fVar58 * fVar159));
            auVar48._12_4_ = -(uint)(ABS(fStack_100c * fVar171) < ABS(fVar155 * fVar160));
            local_1088 = blendvps(auVar166,auVar105,auVar48);
            fVar35 = fVar133 * local_10a8._0_4_ +
                     (float)local_1248._4_4_ * local_1098._0_4_ +
                     local_11f8._4_4_ * local_1088._0_4_;
            fVar59 = fVar133 * local_10a8._4_4_ +
                     (float)local_1248._4_4_ * local_1098._4_4_ +
                     local_11f8._4_4_ * local_1088._4_4_;
            fVar109 = fVar133 * local_10a8._8_4_ +
                      (float)local_1248._4_4_ * local_1098._8_4_ +
                      local_11f8._4_4_ * local_1088._8_4_;
            fVar74 = fVar133 * local_10a8._12_4_ +
                     (float)local_1248._4_4_ * local_1098._12_4_ +
                     local_11f8._4_4_ * local_1088._12_4_;
            auVar144._0_4_ = fVar35 + fVar35;
            auVar144._4_4_ = fVar59 + fVar59;
            auVar144._8_4_ = fVar109 + fVar109;
            auVar144._12_4_ = fVar74 + fVar74;
            auVar61._0_4_ =
                 (float)local_1198._0_4_ * local_1098._0_4_ + (float)local_11e8 * local_1088._0_4_;
            auVar61._4_4_ =
                 (float)local_1198._4_4_ * local_1098._4_4_ + local_11e8._4_4_ * local_1088._4_4_;
            auVar61._8_4_ = fStack_1190 * local_1098._8_4_ + fStack_11e0 * local_1088._8_4_;
            auVar61._12_4_ = fStack_118c * local_1098._12_4_ + fStack_11dc * local_1088._12_4_;
            fVar114 = fVar164 * local_10a8._0_4_ + auVar61._0_4_;
            fVar162 = fVar168 * local_10a8._4_4_ + auVar61._4_4_;
            fVar138 = fStack_1180 * local_10a8._8_4_ + auVar61._8_4_;
            fVar181 = fStack_117c * local_10a8._12_4_ + auVar61._12_4_;
            auVar153 = rcpps(auVar61,auVar144);
            fVar35 = auVar153._0_4_;
            fVar59 = auVar153._4_4_;
            fVar109 = auVar153._8_4_;
            fVar74 = auVar153._12_4_;
            auVar90._0_4_ = fVar114 + fVar114;
            auVar90._4_4_ = fVar162 + fVar162;
            auVar90._8_4_ = fVar138 + fVar138;
            auVar90._12_4_ = fVar181 + fVar181;
            local_10b8[0] = ((1.0 - auVar144._0_4_ * fVar35) * fVar35 + fVar35) * auVar90._0_4_;
            local_10b8[1] = ((1.0 - auVar144._4_4_ * fVar59) * fVar59 + fVar59) * auVar90._4_4_;
            local_10b8[2] = ((1.0 - auVar144._8_4_ * fVar109) * fVar109 + fVar109) * auVar90._8_4_;
            local_10b8[3] = ((1.0 - auVar144._12_4_ * fVar74) * fVar74 + fVar74) * auVar90._12_4_;
            fVar35 = (ray->super_RayK<1>).tfar;
            fVar59 = (ray->super_RayK<1>).org.field_0.m128[3];
            auVar145._0_4_ =
                 (int)((uint)(auVar144._0_4_ != 0.0 &&
                             (local_10b8[0] <= fVar35 && fVar59 <= local_10b8[0])) * -0x80000000) >>
                 0x1f;
            auVar145._4_4_ =
                 (int)((uint)(auVar144._4_4_ != 0.0 &&
                             (local_10b8[1] <= fVar35 && fVar59 <= local_10b8[1])) * -0x80000000) >>
                 0x1f;
            auVar145._8_4_ =
                 (int)((uint)(auVar144._8_4_ != 0.0 &&
                             (local_10b8[2] <= fVar35 && fVar59 <= local_10b8[2])) * -0x80000000) >>
                 0x1f;
            auVar145._12_4_ =
                 (int)((uint)(auVar144._12_4_ != 0.0 &&
                             (local_10b8[3] <= fVar35 && fVar59 <= local_10b8[3])) * -0x80000000) >>
                 0x1f;
            auVar146 = auVar145 & auVar176;
            iVar18 = movmskps(iVar18,auVar146);
            if (iVar18 != 0) {
              local_1128._8_8_ = uStack_1020;
              local_1048._8_8_ = auVar127._8_8_;
              local_1118 = auVar127._0_8_;
              uStack_1110 = local_1048._8_8_;
              local_1108 = local_1038;
              uStack_1100 = uStack_1030;
              local_10f8 = &local_1140;
              local_10e8 = auVar146;
              pGVar11 = (context->scene->geometries).items[uVar8].ptr;
              if ((pGVar11->mask & (ray->super_RayK<1>).mask) != 0) {
                local_11d8 = auVar146;
                auVar15._8_8_ = uStack_1030;
                auVar15._0_8_ = local_1038;
                auVar153 = rcpps(auVar90,auVar15);
                fVar35 = auVar153._0_4_;
                fVar59 = auVar153._4_4_;
                fVar109 = auVar153._8_4_;
                fVar74 = auVar153._12_4_;
                fVar35 = (float)(-(uint)(1e-18 <= ABS((float)local_1038._0_4_)) &
                                (uint)(((float)DAT_01feca10 - (float)local_1038._0_4_ * fVar35) *
                                       fVar35 + fVar35));
                fVar59 = (float)(-(uint)(1e-18 <= ABS((float)local_1038._4_4_)) &
                                (uint)((DAT_01feca10._4_4_ - (float)local_1038._4_4_ * fVar59) *
                                       fVar59 + fVar59));
                fVar163 = (float)(-(uint)(1e-18 <= ABS(fVar163)) &
                                 (uint)((DAT_01feca10._8_4_ - fVar163 * fVar109) * fVar109 + fVar109
                                       ));
                fVar57 = (float)(-(uint)(1e-18 <= ABS(fVar57)) &
                                (uint)((DAT_01feca10._12_4_ - fVar57 * fVar74) * fVar74 + fVar74));
                auVar80._0_4_ = fVar158 * fVar35;
                auVar80._4_4_ = fVar84 * fVar59;
                auVar80._8_4_ = fVar85 * fVar163;
                auVar80._12_4_ = fVar86 * fVar57;
                auVar81 = minps(auVar80,_DAT_01feca10);
                auVar62._0_4_ = fVar35 * fVar150;
                auVar62._4_4_ = fVar59 * fVar132;
                auVar62._8_4_ = fVar163 * auVar127._8_4_;
                auVar62._12_4_ = fVar57 * auVar127._12_4_;
                auVar76 = minps(auVar62,_DAT_01feca10);
                auVar153 = *local_1140;
                auVar123 = auVar153._0_12_;
                auVar175 = *(undefined1 (*) [16])(*local_1140 + uVar20 * 4);
                auVar102 = auVar175._0_12_;
                if (uVar20 == 2) {
                  auVar123._0_8_ = auVar153._0_8_;
                  auVar123._8_4_ = auVar153._4_4_;
                  auVar102._0_8_ = auVar175._0_8_;
                  auVar102._8_4_ = auVar175._4_4_;
                }
                local_11f8 = local_1130;
                auVar128._4_4_ = auVar123._4_4_;
                auVar128._8_4_ = auVar123._8_4_;
                auVar92._0_8_ = auVar123._0_8_;
                auVar92._8_4_ = auVar128._4_4_;
                uVar111 = auVar102._4_4_;
                auVar92._12_4_ = uVar111;
                auVar91._8_8_ = auVar92._8_8_;
                auVar91._0_4_ = auVar123._0_4_;
                uVar19 = auVar102._0_4_;
                auVar91._4_4_ = uVar19;
                auVar128._0_4_ = auVar128._4_4_;
                auVar128._12_4_ = auVar128._8_4_;
                auVar106._0_8_ = auVar102._0_8_;
                auVar106._8_4_ = uVar111;
                auVar106._12_4_ = auVar102._8_4_;
                auVar175 = ZEXT816(0);
                auVar153 = pblendw(auVar91,auVar175,0xaa);
                auVar129 = pblendw(auVar128,auVar175,0xaa);
                auVar175 = pblendw(auVar106,auVar175,0xaa);
                fVar109 = auVar81._0_4_;
                fVar74 = auVar81._4_4_;
                fVar114 = auVar81._8_4_;
                fVar162 = auVar81._12_4_;
                fVar163 = auVar76._0_4_;
                fVar57 = auVar76._4_4_;
                fVar35 = auVar76._8_4_;
                fVar59 = auVar76._12_4_;
                fVar138 = (1.0 - fVar109) - fVar163;
                fVar181 = (1.0 - fVar74) - fVar57;
                fVar182 = (1.0 - fVar114) - fVar35;
                fVar142 = (1.0 - fVar162) - fVar59;
                local_10d8[1] =
                     (float)auVar153._4_4_ * 0.00012207031 * fVar181 +
                     (float)auVar175._4_4_ * 0.00012207031 * fVar57 +
                     (float)auVar129._4_4_ * 0.00012207031 * fVar74;
                local_10d8[0] =
                     (float)auVar153._0_4_ * 0.00012207031 * fVar138 +
                     (float)auVar175._0_4_ * 0.00012207031 * fVar163 +
                     (float)auVar129._0_4_ * 0.00012207031 * fVar109;
                local_10d8[2] =
                     (float)auVar153._8_4_ * 0.00012207031 * fVar182 +
                     (float)auVar175._8_4_ * 0.00012207031 * fVar35 +
                     (float)auVar129._8_4_ * 0.00012207031 * fVar114;
                local_10d8[3] =
                     (float)auVar153._12_4_ * 0.00012207031 * fVar142 +
                     (float)auVar175._12_4_ * 0.00012207031 * fVar59 +
                     (float)auVar129._12_4_ * 0.00012207031 * fVar162;
                local_10c8[1] =
                     fVar181 * (float)(uVar19 >> 0x10) * 0.00012207031 +
                     (float)(uVar111 >> 0x10) * 0.00012207031 * fVar57 +
                     (float)(auVar128._4_4_ >> 0x10) * 0.00012207031 * fVar74;
                local_10c8[0] =
                     fVar138 * (float)(auVar91._0_4_ >> 0x10) * 0.00012207031 +
                     (float)(uVar19 >> 0x10) * 0.00012207031 * fVar163 +
                     (float)(auVar128._4_4_ >> 0x10) * 0.00012207031 * fVar109;
                local_10c8[2] =
                     fVar182 * (float)(auVar128._4_4_ >> 0x10) * 0.00012207031 +
                     (float)(uVar111 >> 0x10) * 0.00012207031 * fVar35 +
                     (float)(auVar128._8_4_ >> 0x10) * 0.00012207031 * fVar114;
                local_10c8[3] =
                     fVar142 * (float)(uVar111 >> 0x10) * 0.00012207031 +
                     (float)(auVar102._8_4_ >> 0x10) * 0.00012207031 * fVar59 +
                     (float)(auVar128._8_4_ >> 0x10) * 0.00012207031 * fVar162;
                auVar118._4_4_ = local_10b8[1];
                auVar118._0_4_ = local_10b8[0];
                auVar118._8_4_ = local_10b8[2];
                auVar118._12_4_ = local_10b8[3];
                auVar175 = blendvps(_DAT_01feb9f0,auVar118,auVar146);
                auVar93._4_4_ = auVar175._0_4_;
                auVar93._0_4_ = auVar175._4_4_;
                auVar93._8_4_ = auVar175._12_4_;
                auVar93._12_4_ = auVar175._8_4_;
                auVar153 = minps(auVar93,auVar175);
                auVar63._0_8_ = auVar153._8_8_;
                auVar63._8_4_ = auVar153._0_4_;
                auVar63._12_4_ = auVar153._4_4_;
                auVar153 = minps(auVar63,auVar153);
                auVar64._0_8_ =
                     CONCAT44(-(uint)(auVar153._4_4_ == auVar175._4_4_) & auVar146._4_4_,
                              -(uint)(auVar153._0_4_ == auVar175._0_4_) & auVar146._0_4_);
                auVar64._8_4_ = -(uint)(auVar153._8_4_ == auVar175._8_4_) & auVar146._8_4_;
                auVar64._12_4_ = -(uint)(auVar153._12_4_ == auVar175._12_4_) & auVar146._12_4_;
                iVar18 = movmskps(*(uint *)(local_1230 + 0xc),auVar64);
                if (iVar18 != 0) {
                  auVar146._8_4_ = auVar64._8_4_;
                  auVar146._0_8_ = auVar64._0_8_;
                  auVar146._12_4_ = auVar64._12_4_;
                }
                uVar19 = movmskps(iVar18,auVar146);
                lVar25 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar163 = local_10d8[lVar25];
                  fVar57 = local_10c8[lVar25];
                  fVar35 = *(float *)(local_10a8 + lVar25 * 4);
                  fVar59 = *(float *)(local_1098 + lVar25 * 4);
                  fVar109 = *(float *)(local_1088 + lVar25 * 4);
                  (ray->super_RayK<1>).tfar = local_10b8[lVar25];
                  (ray->Ng).field_0.field_0.x = fVar35;
                  (ray->Ng).field_0.field_0.y = fVar59;
                  (ray->Ng).field_0.field_0.z = fVar109;
                  ray->u = fVar163;
                  ray->v = fVar57;
                  ray->primID = (uint)local_120c;
                  ray->geomID = uVar8;
                  pRVar12 = context->user;
                  ray->instID[0] = pRVar12->instID[0];
                  ray->instPrimID[0] = pRVar12->instPrimID[0];
                  uVar21 = local_11f8;
                }
                else {
                  local_1208 = (undefined1  [8])context->args;
                  local_1078 = context->user;
                  local_1188 = uVar20;
                  local_1248 = auVar28;
                  _local_1198 = auVar118;
                  aStack_121c._4_8_ = uVar31;
                  _local_1028 = auVar154;
                  do {
                    local_116c = local_10d8[lVar25];
                    local_1168 = local_10c8[lVar25];
                    local_11e8._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = local_10b8[lVar25];
                    local_1178 = *(float *)(local_10a8 + lVar25 * 4);
                    local_1174 = *(undefined4 *)(local_1098 + lVar25 * 4);
                    local_1170 = *(undefined4 *)(local_1088 + lVar25 * 4);
                    local_1164 = local_120c;
                    local_1160 = (int)local_1228;
                    local_115c = local_1078->instID[0];
                    local_1158 = local_1078->instPrimID[0];
                    local_124c = (undefined1  [4])0xffffffff;
                    local_11c8.valid = (int *)local_124c;
                    local_11c8.geometryUserPtr = pGVar11->userPtr;
                    local_11c8.context = local_1078;
                    local_11c8.ray = (RTCRayN *)ray;
                    local_11c8.hit = (RTCHitN *)&local_1178;
                    local_11c8.N = 1;
                    if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e878b1:
                      if (*(Device **)((long)local_1208 + 0x10) != (Device *)0x0) {
                        auVar26 = local_1208;
                        if ((((ulong)((RefCount *)local_1208)->_vptr_RefCount & 2) != 0) ||
                           (auVar26 = (undefined1  [8])pGVar11,
                           ((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                          (*(code *)*(Device **)((long)local_1208 + 0x10))(&local_11c8);
                          auVar28 = local_1248;
                          uVar31 = aStack_121c._4_8_;
                          uVar20 = local_1188;
                          auVar118 = _local_1198;
                        }
                        if ((((RayK<1> *)local_11c8.valid)->org).field_0.m128[0] == 0.0)
                        goto LAB_00e87979;
                      }
                      (((Vec3f *)((long)local_11c8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11c8.hit;
                      (((Vec3f *)((long)local_11c8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11c8.hit + 4);
                      (((Vec3f *)((long)local_11c8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11c8.hit + 8);
                      *(float *)((long)local_11c8.ray + 0x3c) = *(float *)(local_11c8.hit + 0xc);
                      *(float *)((long)local_11c8.ray + 0x40) = *(float *)(local_11c8.hit + 0x10);
                      *(float *)((long)local_11c8.ray + 0x44) = *(float *)(local_11c8.hit + 0x14);
                      *(float *)((long)local_11c8.ray + 0x48) = *(float *)(local_11c8.hit + 0x18);
                      *(float *)((long)local_11c8.ray + 0x4c) = *(float *)(local_11c8.hit + 0x1c);
                      auVar26 = (undefined1  [8])(ulong)(uint)*(float *)(local_11c8.hit + 0x20);
                      *(float *)((long)local_11c8.ray + 0x50) = *(float *)(local_11c8.hit + 0x20);
                      pRVar23 = (RayHit *)local_11c8.ray;
                      auVar28 = local_1248;
                    }
                    else {
                      auVar26 = (undefined1  [8])pGVar11;
                      (*pGVar11->intersectionFilterN)(&local_11c8);
                      auVar28 = local_1248;
                      uVar31 = aStack_121c._4_8_;
                      uVar20 = local_1188;
                      auVar118 = _local_1198;
                      if ((((RayK<1> *)local_11c8.valid)->org).field_0.m128[0] != 0.0)
                      goto LAB_00e878b1;
LAB_00e87979:
                      (ray->super_RayK<1>).tfar = (float)local_11e8;
                      pRVar23 = (RayHit *)local_11c8.valid;
                    }
                    *(undefined4 *)(local_11d8 + lVar25 * 4) = 0;
                    fVar163 = (ray->super_RayK<1>).tfar;
                    auVar53._0_4_ = -(uint)(auVar118._0_4_ <= fVar163) & local_11d8._0_4_;
                    auVar53._4_4_ = -(uint)(auVar118._4_4_ <= fVar163) & local_11d8._4_4_;
                    auVar53._8_4_ = -(uint)(auVar118._8_4_ <= fVar163) & local_11d8._8_4_;
                    auVar53._12_4_ = -(uint)(auVar118._12_4_ <= fVar163) & local_11d8._12_4_;
                    local_11d8 = auVar53;
                    iVar18 = movmskps((int)pRVar23,auVar53);
                    if (iVar18 != 0) {
                      auVar153 = blendvps(_DAT_01feb9f0,auVar118,auVar53);
                      auVar98._4_4_ = auVar153._0_4_;
                      auVar98._0_4_ = auVar153._4_4_;
                      auVar98._8_4_ = auVar153._12_4_;
                      auVar98._12_4_ = auVar153._8_4_;
                      auVar154 = minps(auVar98,auVar153);
                      auVar69._0_8_ = auVar154._8_8_;
                      auVar69._8_4_ = auVar154._0_4_;
                      auVar69._12_4_ = auVar154._4_4_;
                      auVar154 = minps(auVar69,auVar154);
                      auVar70._0_8_ =
                           CONCAT44(-(uint)(auVar154._4_4_ == auVar153._4_4_) & auVar53._4_4_,
                                    -(uint)(auVar154._0_4_ == auVar153._0_4_) & auVar53._0_4_);
                      auVar70._8_4_ = -(uint)(auVar154._8_4_ == auVar153._8_4_) & auVar53._8_4_;
                      auVar70._12_4_ = -(uint)(auVar154._12_4_ == auVar153._12_4_) & auVar53._12_4_;
                      iVar24 = movmskps(SUB84(auVar26,0),auVar70);
                      if (iVar24 != 0) {
                        auVar53._8_4_ = auVar70._8_4_;
                        auVar53._0_8_ = auVar70._0_8_;
                        auVar53._12_4_ = auVar70._12_4_;
                      }
                      uVar29 = movmskps(iVar24,auVar53);
                      uVar21 = CONCAT44((int)((ulong)auVar26 >> 0x20),uVar29);
                      lVar25 = 0;
                      if (uVar21 != 0) {
                        for (; (uVar21 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                        }
                      }
                    }
                    uVar21 = local_11f8;
                  } while ((char)iVar18 != '\0');
                }
              }
            }
          }
          if (2 < (uint)uVar21) {
            lVar25 = (long)auVar28 + uVar20 * 4;
            pfVar22 = (float *)(lVar25 + 0x2c);
            fVar163 = *(float *)(lVar25 + 0x30);
            pfVar6 = pfVar22 + uVar20;
            fVar57 = pfVar6[1];
            fVar35 = *(float *)(lVar25 + 0x34);
            fVar59 = pfVar6[2];
            if (uVar20 == 2) {
              fVar35 = fVar163;
              fVar59 = fVar57;
            }
            uVar33 = (ulong)*(uint *)(local_1230 + 0x14);
            pfVar2 = pfVar22 + uVar33;
            fVar109 = pfVar2[1];
            pfVar3 = pfVar2 + uVar20;
            fVar74 = pfVar3[1];
            fVar114 = pfVar2[2];
            fVar162 = pfVar3[2];
            if (uVar20 == 2) {
              fVar114 = fVar109;
              fVar162 = fVar74;
            }
            pfVar4 = pfVar22 + uVar33 * 2;
            fVar138 = pfVar4[1];
            pfVar5 = pfVar4 + uVar20;
            fVar181 = pfVar5[1];
            fVar182 = pfVar4[2];
            fVar142 = pfVar5[2];
            if (uVar20 == 2) {
              fVar182 = fVar138;
              fVar142 = fVar181;
            }
            fVar36 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar56 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar58 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar133 = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_1228._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_11f8._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar164 = *pfVar22 - fVar36;
            fVar168 = *pfVar6 - fVar36;
            fStack_1180 = fVar163 - fVar36;
            fStack_117c = fVar57 - fVar36;
            local_1198._0_4_ = *pfVar2 - fVar56;
            local_1198._4_4_ = *pfVar3 - fVar56;
            fStack_1190 = fVar109 - fVar56;
            fStack_118c = fVar74 - fVar56;
            fVar159 = *pfVar4 - fVar58;
            fVar160 = *pfVar5 - fVar58;
            fStack_11e0 = fVar138 - fVar58;
            fStack_11dc = fVar181 - fVar58;
            fVar158 = fVar163 - fVar36;
            fVar163 = fVar163 - fVar36;
            fVar86 = fVar35 - fVar36;
            fVar35 = fVar35 - fVar36;
            fVar110 = fVar109 - fVar56;
            fVar109 = fVar109 - fVar56;
            fVar112 = fVar114 - fVar56;
            fVar114 = fVar114 - fVar56;
            fVar150 = fVar138 - fVar58;
            fVar138 = fVar138 - fVar58;
            fVar135 = fVar182 - fVar58;
            fVar182 = fVar182 - fVar58;
            fVar55 = *pfVar6 - fVar36;
            fVar155 = fVar57 - fVar36;
            fVar57 = fVar57 - fVar36;
            fVar59 = fVar59 - fVar36;
            fVar73 = *pfVar3 - fVar56;
            fVar75 = fVar74 - fVar56;
            fVar74 = fVar74 - fVar56;
            fVar162 = fVar162 - fVar56;
            fVar179 = *pfVar5 - fVar58;
            fVar180 = fVar181 - fVar58;
            fVar181 = fVar181 - fVar58;
            fVar142 = fVar142 - fVar58;
            local_1208._0_4_ = fVar55 - fVar164;
            local_1208._4_4_ = fVar155 - fVar168;
            fStack_1200 = fVar57 - fStack_1180;
            fStack_11fc = fVar59 - fStack_117c;
            local_1018 = fVar73 - (float)local_1198._0_4_;
            fStack_1014 = fVar75 - (float)local_1198._4_4_;
            fStack_1010 = fVar74 - fStack_1190;
            fStack_100c = fVar162 - fStack_118c;
            fVar141 = fVar179 - fVar159;
            fVar151 = fVar180 - fVar160;
            fStack_1070 = fVar181 - fStack_11e0;
            fStack_106c = fVar142 - fStack_11dc;
            local_1078 = (RTCRayQueryContext *)CONCAT44(fVar151,fVar141);
            local_11f8._4_4_ = (float)local_11f8;
            fStack_11f0 = (float)local_11f8;
            fStack_11ec = (float)local_11f8;
            fVar183 = (float)local_1198._0_4_ - fVar110;
            fVar186 = (float)local_1198._4_4_ - fVar109;
            fVar187 = fStack_1190 - fVar112;
            fVar188 = fStack_118c - fVar114;
            fVar84 = (local_1018 * (fVar179 + fVar159) -
                     fVar141 * (fVar73 + (float)local_1198._0_4_)) * fVar133 +
                     (fVar141 * (fVar55 + fVar164) - (fVar179 + fVar159) * (float)local_1208._0_4_)
                     * local_1228._4_4_ +
                     ((fVar73 + (float)local_1198._0_4_) * (float)local_1208._0_4_ -
                     (fVar55 + fVar164) * local_1018) * (float)local_11f8;
            fVar85 = (fStack_1014 * (fVar180 + fVar160) -
                     fVar151 * (fVar75 + (float)local_1198._4_4_)) * fVar133 +
                     (fVar151 * (fVar155 + fVar168) - (fVar180 + fVar160) * (float)local_1208._4_4_)
                     * local_1228._4_4_ +
                     ((fVar75 + (float)local_1198._4_4_) * (float)local_1208._4_4_ -
                     (fVar155 + fVar168) * fStack_1014) * (float)local_11f8;
            local_1128._0_8_ = CONCAT44(fVar85,fVar84);
            fVar100 = (fStack_1010 * (fVar181 + fStack_11e0) - fStack_1070 * (fVar74 + fStack_1190))
                      * fVar133 +
                      (fStack_1070 * (fVar57 + fStack_1180) - (fVar181 + fStack_11e0) * fStack_1200)
                      * local_1228._4_4_ +
                      ((fVar74 + fStack_1190) * fStack_1200 - (fVar57 + fStack_1180) * fStack_1010)
                      * (float)local_11f8;
            fVar101 = (fStack_100c * (fVar142 + fStack_11dc) - fStack_106c * (fVar162 + fStack_118c)
                      ) * fVar133 +
                      (fStack_106c * (fVar59 + fStack_117c) - (fVar142 + fStack_11dc) * fStack_11fc)
                      * local_1228._4_4_ +
                      ((fVar162 + fStack_118c) * fStack_11fc - (fVar59 + fStack_117c) * fStack_100c)
                      * (float)local_11f8;
            fVar36 = fVar159 - fVar150;
            fVar56 = fVar160 - fVar138;
            fVar58 = fStack_11e0 - fVar135;
            fVar60 = fStack_11dc - fVar182;
            local_11e8 = CONCAT44(fVar160,fVar159);
            fVar165 = fVar164 - fVar158;
            fVar169 = fVar168 - fVar163;
            fVar170 = fStack_1180 - fVar86;
            fVar171 = fStack_117c - fVar35;
            local_1188 = CONCAT44(fVar168,fVar164);
            fVar121 = (fVar183 * (fVar159 + fVar150) - fVar36 * ((float)local_1198._0_4_ + fVar110))
                      * fVar133 +
                      (fVar36 * (fVar164 + fVar158) - (fVar159 + fVar150) * fVar165) *
                      local_1228._4_4_ +
                      (((float)local_1198._0_4_ + fVar110) * fVar165 - (fVar164 + fVar158) * fVar183
                      ) * (float)local_11f8;
            fVar122 = (fVar186 * (fVar160 + fVar138) - fVar56 * ((float)local_1198._4_4_ + fVar109))
                      * fVar133 +
                      (fVar56 * (fVar168 + fVar163) - (fVar160 + fVar138) * fVar169) *
                      local_1228._4_4_ +
                      (((float)local_1198._4_4_ + fVar109) * fVar169 - (fVar168 + fVar163) * fVar186
                      ) * (float)local_11f8;
            auVar130._0_8_ = CONCAT44(fVar122,fVar121);
            auVar130._8_4_ =
                 (fVar187 * (fStack_11e0 + fVar135) - fVar58 * (fStack_1190 + fVar112)) * fVar133 +
                 (fVar58 * (fStack_1180 + fVar86) - (fStack_11e0 + fVar135) * fVar170) *
                 local_1228._4_4_ +
                 ((fStack_1190 + fVar112) * fVar170 - (fStack_1180 + fVar86) * fVar187) *
                 (float)local_11f8;
            auVar130._12_4_ =
                 (fVar188 * (fStack_11dc + fVar182) - fVar60 * (fStack_118c + fVar114)) * fVar133 +
                 (fVar60 * (fStack_117c + fVar35) - (fStack_11dc + fVar182) * fVar171) *
                 local_1228._4_4_ +
                 ((fStack_118c + fVar114) * fVar171 - (fStack_117c + fVar35) * fVar188) *
                 (float)local_11f8;
            fVar143 = fVar158 - fVar55;
            fVar152 = fVar163 - fVar155;
            fVar156 = fVar86 - fVar57;
            fVar157 = fVar35 - fVar59;
            fVar132 = fVar110 - fVar73;
            fVar134 = fVar109 - fVar75;
            fVar139 = fVar112 - fVar74;
            fVar140 = fVar114 - fVar162;
            fVar113 = fVar150 - fVar179;
            fVar115 = fVar138 - fVar180;
            fVar161 = fVar135 - fVar181;
            fVar120 = fVar182 - fVar142;
            local_1228._0_4_ = (int)local_1228._4_4_;
            fStack_1220 = local_1228._4_4_;
            aStack_121c.field_0.x = local_1228._4_4_;
            auVar82._0_4_ =
                 (fVar132 * (fVar179 + fVar150) - fVar113 * (fVar73 + fVar110)) * fVar133 +
                 (fVar113 * (fVar55 + fVar158) - (fVar179 + fVar150) * fVar143) * local_1228._4_4_ +
                 ((fVar73 + fVar110) * fVar143 - (fVar55 + fVar158) * fVar132) * (float)local_11f8;
            auVar82._4_4_ =
                 (fVar134 * (fVar180 + fVar138) - fVar115 * (fVar75 + fVar109)) * fVar133 +
                 (fVar115 * (fVar155 + fVar163) - (fVar180 + fVar138) * fVar152) * local_1228._4_4_
                 + ((fVar75 + fVar109) * fVar152 - (fVar155 + fVar163) * fVar134) *
                   (float)local_11f8;
            auVar82._8_4_ =
                 (fVar139 * (fVar181 + fVar135) - fVar161 * (fVar74 + fVar112)) * fVar133 +
                 (fVar161 * (fVar57 + fVar86) - (fVar181 + fVar135) * fVar156) * local_1228._4_4_ +
                 ((fVar74 + fVar112) * fVar156 - (fVar57 + fVar86) * fVar139) * (float)local_11f8;
            auVar82._12_4_ =
                 (fVar140 * (fVar142 + fVar182) - fVar120 * (fVar162 + fVar114)) * fVar133 +
                 (fVar120 * (fVar59 + fVar35) - (fVar142 + fVar182) * fVar157) * local_1228._4_4_ +
                 ((fVar162 + fVar114) * fVar157 - (fVar59 + fVar35) * fVar140) * (float)local_11f8;
            local_1028._0_4_ = fVar84 + fVar121 + auVar82._0_4_;
            local_1028._4_4_ = fVar85 + fVar122 + auVar82._4_4_;
            fVar163 = fVar100 + auVar130._8_4_ + auVar82._8_4_;
            fVar57 = fVar101 + auVar130._12_4_ + auVar82._12_4_;
            auVar49._8_4_ = fVar100;
            auVar49._0_8_ = local_1128._0_8_;
            auVar49._12_4_ = fVar101;
            auVar154 = minps(auVar49,auVar130);
            auVar153 = minps(auVar154,auVar82);
            fStack_1240 = fVar100;
            local_1248 = (undefined1  [8])local_1128._0_8_;
            fStack_123c = fVar101;
            auVar177._8_4_ = fVar100;
            auVar177._0_8_ = local_1128._0_8_;
            auVar177._12_4_ = fVar101;
            _local_1038 = auVar130;
            auVar154 = _local_1038;
            auVar175 = maxps(auVar177,auVar130);
            auVar175 = maxps(auVar175,auVar82);
            uStack_1020._0_4_ = fVar163;
            uStack_1020._4_4_ = fVar57;
            local_1140 = (undefined1 (*) [16])(pfVar22 + uVar33 * 3);
            local_1138 = uVar20;
            local_1130 = uVar21;
            uVar8 = *(uint *)(local_1230 + 0x18);
            uVar21 = (ulong)uVar8;
            local_1164 = *(float *)(local_1230 + 0x1c);
            local_10f8 = &local_1140;
            auVar178._0_4_ =
                 -(uint)(auVar175._0_4_ <= ABS((float)local_1028._0_4_) * 1.1920929e-07 ||
                        -(ABS((float)local_1028._0_4_) * 1.1920929e-07) <= auVar153._0_4_) &
                 local_f88;
            auVar178._4_4_ =
                 -(uint)(auVar175._4_4_ <= ABS((float)local_1028._4_4_) * 1.1920929e-07 ||
                        -(ABS((float)local_1028._4_4_) * 1.1920929e-07) <= auVar153._4_4_) &
                 uStack_f84;
            auVar178._8_4_ =
                 -(uint)(auVar175._8_4_ <= ABS(fVar163) * 1.1920929e-07 ||
                        -(ABS(fVar163) * 1.1920929e-07) <= auVar153._8_4_) & uStack_f80;
            auVar178._12_4_ =
                 -(uint)(auVar175._12_4_ <= ABS(fVar57) * 1.1920929e-07 ||
                        -(ABS(fVar57) * 1.1920929e-07) <= auVar153._12_4_) & uStack_f7c;
            iVar18 = movmskps((int)&local_1140,auVar178);
            if (iVar18 != 0) {
              auVar137._0_4_ = local_1018 * fVar36 - fVar141 * fVar183;
              auVar137._4_4_ = fStack_1014 * fVar56 - fVar151 * fVar186;
              auVar137._8_4_ = fStack_1010 * fVar58 - fStack_1070 * fVar187;
              auVar137._12_4_ = fStack_100c * fVar60 - fStack_106c * fVar188;
              auVar185._0_4_ = fVar183 * fVar113 - fVar36 * fVar132;
              auVar185._4_4_ = fVar186 * fVar115 - fVar56 * fVar134;
              auVar185._8_4_ = fVar187 * fVar161 - fVar58 * fVar139;
              auVar185._12_4_ = fVar188 * fVar120 - fVar60 * fVar140;
              auVar50._4_4_ = -(uint)(ABS(fVar151 * fVar186) < ABS(fVar56 * fVar134));
              auVar50._0_4_ = -(uint)(ABS(fVar141 * fVar183) < ABS(fVar36 * fVar132));
              auVar50._8_4_ = -(uint)(ABS(fStack_1070 * fVar187) < ABS(fVar58 * fVar139));
              auVar50._12_4_ = -(uint)(ABS(fStack_106c * fVar188) < ABS(fVar60 * fVar140));
              local_10a8 = blendvps(auVar185,auVar137,auVar50);
              auVar173._0_4_ = fVar36 * fVar143 - fVar165 * fVar113;
              auVar173._4_4_ = fVar56 * fVar152 - fVar169 * fVar115;
              auVar173._8_4_ = fVar58 * fVar156 - fVar170 * fVar161;
              auVar173._12_4_ = fVar60 * fVar157 - fVar171 * fVar120;
              auVar51._4_4_ =
                   -(uint)(ABS((float)local_1208._4_4_ * fVar56) < ABS(fVar169 * fVar115));
              auVar51._0_4_ =
                   -(uint)(ABS((float)local_1208._0_4_ * fVar36) < ABS(fVar165 * fVar113));
              auVar51._8_4_ = -(uint)(ABS(fStack_1200 * fVar58) < ABS(fVar170 * fVar161));
              auVar51._12_4_ = -(uint)(ABS(fStack_11fc * fVar60) < ABS(fVar171 * fVar120));
              auVar14._4_4_ = fVar151 * fVar169 - (float)local_1208._4_4_ * fVar56;
              auVar14._0_4_ = fVar141 * fVar165 - (float)local_1208._0_4_ * fVar36;
              auVar14._8_4_ = fStack_1070 * fVar170 - fStack_1200 * fVar58;
              auVar14._12_4_ = fStack_106c * fVar171 - fStack_11fc * fVar60;
              local_1098 = blendvps(auVar173,auVar14,auVar51);
              auVar107._0_4_ = (float)local_1208._0_4_ * fVar183 - local_1018 * fVar165;
              auVar107._4_4_ = (float)local_1208._4_4_ * fVar186 - fStack_1014 * fVar169;
              auVar107._8_4_ = fStack_1200 * fVar187 - fStack_1010 * fVar170;
              auVar107._12_4_ = fStack_11fc * fVar188 - fStack_100c * fVar171;
              auVar167._0_4_ = fVar165 * fVar132 - fVar183 * fVar143;
              auVar167._4_4_ = fVar169 * fVar134 - fVar186 * fVar152;
              auVar167._8_4_ = fVar170 * fVar139 - fVar187 * fVar156;
              auVar167._12_4_ = fVar171 * fVar140 - fVar188 * fVar157;
              auVar52._4_4_ = -(uint)(ABS(fStack_1014 * fVar169) < ABS(fVar186 * fVar152));
              auVar52._0_4_ = -(uint)(ABS(local_1018 * fVar165) < ABS(fVar183 * fVar143));
              auVar52._8_4_ = -(uint)(ABS(fStack_1010 * fVar170) < ABS(fVar187 * fVar156));
              auVar52._12_4_ = -(uint)(ABS(fStack_100c * fVar171) < ABS(fVar188 * fVar157));
              local_1088 = blendvps(auVar167,auVar107,auVar52);
              fVar35 = fVar133 * local_10a8._0_4_ +
                       local_1228._4_4_ * local_1098._0_4_ + (float)local_11f8 * local_1088._0_4_;
              fVar59 = fVar133 * local_10a8._4_4_ +
                       local_1228._4_4_ * local_1098._4_4_ + (float)local_11f8 * local_1088._4_4_;
              fVar109 = fVar133 * local_10a8._8_4_ +
                        local_1228._4_4_ * local_1098._8_4_ + (float)local_11f8 * local_1088._8_4_;
              fVar74 = fVar133 * local_10a8._12_4_ +
                       local_1228._4_4_ * local_1098._12_4_ + (float)local_11f8 * local_1088._12_4_;
              auVar147._0_4_ = fVar35 + fVar35;
              auVar147._4_4_ = fVar59 + fVar59;
              auVar147._8_4_ = fVar109 + fVar109;
              auVar147._12_4_ = fVar74 + fVar74;
              auVar65._0_4_ =
                   (float)local_1198._0_4_ * local_1098._0_4_ + fVar159 * local_1088._0_4_;
              auVar65._4_4_ =
                   (float)local_1198._4_4_ * local_1098._4_4_ + fVar160 * local_1088._4_4_;
              auVar65._8_4_ = fStack_1190 * local_1098._8_4_ + fStack_11e0 * local_1088._8_4_;
              auVar65._12_4_ = fStack_118c * local_1098._12_4_ + fStack_11dc * local_1088._12_4_;
              fVar114 = fVar164 * local_10a8._0_4_ + auVar65._0_4_;
              fVar162 = fVar168 * local_10a8._4_4_ + auVar65._4_4_;
              fVar138 = fStack_1180 * local_10a8._8_4_ + auVar65._8_4_;
              fVar181 = fStack_117c * local_10a8._12_4_ + auVar65._12_4_;
              auVar153 = rcpps(auVar65,auVar147);
              fVar35 = auVar153._0_4_;
              fVar59 = auVar153._4_4_;
              fVar109 = auVar153._8_4_;
              fVar74 = auVar153._12_4_;
              auVar94._0_4_ = fVar114 + fVar114;
              auVar94._4_4_ = fVar162 + fVar162;
              auVar94._8_4_ = fVar138 + fVar138;
              auVar94._12_4_ = fVar181 + fVar181;
              local_10b8[0] = ((1.0 - auVar147._0_4_ * fVar35) * fVar35 + fVar35) * auVar94._0_4_;
              local_10b8[1] = ((1.0 - auVar147._4_4_ * fVar59) * fVar59 + fVar59) * auVar94._4_4_;
              local_10b8[2] = ((1.0 - auVar147._8_4_ * fVar109) * fVar109 + fVar109) * auVar94._8_4_
              ;
              local_10b8[3] = ((1.0 - auVar147._12_4_ * fVar74) * fVar74 + fVar74) * auVar94._12_4_;
              fVar35 = (ray->super_RayK<1>).tfar;
              fVar59 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar148._0_4_ =
                   (int)((uint)(auVar147._0_4_ != 0.0 &&
                               (local_10b8[0] <= fVar35 && fVar59 <= local_10b8[0])) * -0x80000000)
                   >> 0x1f;
              auVar148._4_4_ =
                   (int)((uint)(auVar147._4_4_ != 0.0 &&
                               (local_10b8[1] <= fVar35 && fVar59 <= local_10b8[1])) * -0x80000000)
                   >> 0x1f;
              auVar148._8_4_ =
                   (int)((uint)(auVar147._8_4_ != 0.0 &&
                               (local_10b8[2] <= fVar35 && fVar59 <= local_10b8[2])) * -0x80000000)
                   >> 0x1f;
              auVar148._12_4_ =
                   (int)((uint)(auVar147._12_4_ != 0.0 &&
                               (local_10b8[3] <= fVar35 && fVar59 <= local_10b8[3])) * -0x80000000)
                   >> 0x1f;
              auVar149 = auVar148 & auVar178;
              iVar18 = movmskps(iVar18,auVar149);
              if (iVar18 != 0) {
                local_1128._8_8_ = _fStack_1240;
                uStack_1030 = auVar130._8_8_;
                local_1118 = auVar130._0_8_;
                uStack_1110 = uStack_1030;
                local_1108 = local_1028;
                uStack_1100 = uStack_1020;
                local_10f8 = &local_1140;
                local_10e8 = auVar149;
                pGVar11 = (context->scene->geometries).items[uVar21].ptr;
                if ((pGVar11->mask & (ray->super_RayK<1>).mask) != 0) {
                  local_11d8 = auVar149;
                  auVar16._8_8_ = uStack_1020;
                  auVar16._0_8_ = local_1028;
                  auVar153 = rcpps(auVar94,auVar16);
                  fVar35 = auVar153._0_4_;
                  fVar59 = auVar153._4_4_;
                  fVar109 = auVar153._8_4_;
                  fVar74 = auVar153._12_4_;
                  fVar35 = (float)(-(uint)(1e-18 <= ABS((float)local_1028._0_4_)) &
                                  (uint)(((float)DAT_01feca10 - (float)local_1028._0_4_ * fVar35) *
                                         fVar35 + fVar35));
                  fVar59 = (float)(-(uint)(1e-18 <= ABS((float)local_1028._4_4_)) &
                                  (uint)((DAT_01feca10._4_4_ - (float)local_1028._4_4_ * fVar59) *
                                         fVar59 + fVar59));
                  fVar163 = (float)(-(uint)(1e-18 <= ABS(fVar163)) &
                                   (uint)((DAT_01feca10._8_4_ - fVar163 * fVar109) * fVar109 +
                                         fVar109));
                  fVar57 = (float)(-(uint)(1e-18 <= ABS(fVar57)) &
                                  (uint)((DAT_01feca10._12_4_ - fVar57 * fVar74) * fVar74 + fVar74))
                  ;
                  auVar83._0_4_ = fVar84 * fVar35;
                  auVar83._4_4_ = fVar85 * fVar59;
                  auVar83._8_4_ = fVar100 * fVar163;
                  auVar83._12_4_ = fVar101 * fVar57;
                  auVar81 = minps(auVar83,_DAT_01feca10);
                  auVar66._0_4_ = fVar35 * fVar121;
                  auVar66._4_4_ = fVar59 * fVar122;
                  auVar66._8_4_ = fVar163 * auVar130._8_4_;
                  auVar66._12_4_ = fVar57 * auVar130._12_4_;
                  auVar76 = minps(auVar66,_DAT_01feca10);
                  auVar153 = *local_1140;
                  auVar124 = auVar153._0_12_;
                  auVar175 = *(undefined1 (*) [16])(*local_1140 + uVar20 * 4);
                  auVar103 = auVar175._0_12_;
                  if (uVar20 == 2) {
                    auVar124._0_8_ = auVar153._0_8_;
                    auVar124._8_4_ = auVar153._4_4_;
                    auVar103._0_8_ = auVar175._0_8_;
                    auVar103._8_4_ = auVar175._4_4_;
                  }
                  auVar131._4_4_ = auVar124._4_4_;
                  auVar131._8_4_ = auVar124._8_4_;
                  auVar96._0_8_ = auVar124._0_8_;
                  auVar96._8_4_ = auVar131._4_4_;
                  uVar111 = auVar103._4_4_;
                  auVar96._12_4_ = uVar111;
                  auVar95._8_8_ = auVar96._8_8_;
                  auVar95._0_4_ = auVar124._0_4_;
                  uVar19 = auVar103._0_4_;
                  auVar95._4_4_ = uVar19;
                  auVar131._0_4_ = auVar131._4_4_;
                  auVar131._12_4_ = auVar131._8_4_;
                  auVar108._0_8_ = auVar103._0_8_;
                  auVar108._8_4_ = uVar111;
                  auVar108._12_4_ = auVar103._8_4_;
                  auVar175 = ZEXT816(0);
                  auVar153 = pblendw(auVar95,auVar175,0xaa);
                  auVar129 = pblendw(auVar131,auVar175,0xaa);
                  auVar175 = pblendw(auVar108,auVar175,0xaa);
                  fVar109 = auVar81._0_4_;
                  fVar74 = auVar81._4_4_;
                  fVar114 = auVar81._8_4_;
                  fVar162 = auVar81._12_4_;
                  fVar163 = auVar76._0_4_;
                  fVar57 = auVar76._4_4_;
                  fVar35 = auVar76._8_4_;
                  fVar59 = auVar76._12_4_;
                  fVar138 = (1.0 - fVar109) - fVar163;
                  fVar181 = (1.0 - fVar74) - fVar57;
                  fVar182 = (1.0 - fVar114) - fVar35;
                  fVar142 = (1.0 - fVar162) - fVar59;
                  local_10d8[1] =
                       (float)auVar153._4_4_ * 0.00012207031 * fVar181 +
                       (float)auVar175._4_4_ * 0.00012207031 * fVar57 +
                       (float)auVar129._4_4_ * 0.00012207031 * fVar74;
                  local_10d8[0] =
                       (float)auVar153._0_4_ * 0.00012207031 * fVar138 +
                       (float)auVar175._0_4_ * 0.00012207031 * fVar163 +
                       (float)auVar129._0_4_ * 0.00012207031 * fVar109;
                  local_10d8[2] =
                       (float)auVar153._8_4_ * 0.00012207031 * fVar182 +
                       (float)auVar175._8_4_ * 0.00012207031 * fVar35 +
                       (float)auVar129._8_4_ * 0.00012207031 * fVar114;
                  local_10d8[3] =
                       (float)auVar153._12_4_ * 0.00012207031 * fVar142 +
                       (float)auVar175._12_4_ * 0.00012207031 * fVar59 +
                       (float)auVar129._12_4_ * 0.00012207031 * fVar162;
                  local_10c8[1] =
                       fVar181 * (float)(uVar19 >> 0x10) * 0.00012207031 +
                       (float)(uVar111 >> 0x10) * 0.00012207031 * fVar57 +
                       (float)(auVar131._4_4_ >> 0x10) * 0.00012207031 * fVar74;
                  local_10c8[0] =
                       fVar138 * (float)(auVar95._0_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar19 >> 0x10) * 0.00012207031 * fVar163 +
                       (float)(auVar131._4_4_ >> 0x10) * 0.00012207031 * fVar109;
                  local_10c8[2] =
                       fVar182 * (float)(auVar131._4_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar111 >> 0x10) * 0.00012207031 * fVar35 +
                       (float)(auVar131._8_4_ >> 0x10) * 0.00012207031 * fVar114;
                  local_10c8[3] =
                       fVar142 * (float)(uVar111 >> 0x10) * 0.00012207031 +
                       (float)(auVar103._8_4_ >> 0x10) * 0.00012207031 * fVar59 +
                       (float)(auVar131._8_4_ >> 0x10) * 0.00012207031 * fVar162;
                  auVar119._4_4_ = local_10b8[1];
                  auVar119._0_4_ = local_10b8[0];
                  auVar119._8_4_ = local_10b8[2];
                  auVar119._12_4_ = local_10b8[3];
                  auVar175 = blendvps(_DAT_01feb9f0,auVar119,auVar149);
                  auVar97._4_4_ = auVar175._0_4_;
                  auVar97._0_4_ = auVar175._4_4_;
                  auVar97._8_4_ = auVar175._12_4_;
                  auVar97._12_4_ = auVar175._8_4_;
                  auVar153 = minps(auVar97,auVar175);
                  auVar67._0_8_ = auVar153._8_8_;
                  auVar67._8_4_ = auVar153._0_4_;
                  auVar67._12_4_ = auVar153._4_4_;
                  auVar153 = minps(auVar67,auVar153);
                  auVar68._0_8_ =
                       CONCAT44(-(uint)(auVar153._4_4_ == auVar175._4_4_) & auVar149._4_4_,
                                -(uint)(auVar153._0_4_ == auVar175._0_4_) & auVar149._0_4_);
                  auVar68._8_4_ = -(uint)(auVar153._8_4_ == auVar175._8_4_) & auVar149._8_4_;
                  auVar68._12_4_ = -(uint)(auVar153._12_4_ == auVar175._12_4_) & auVar149._12_4_;
                  iVar18 = movmskps((int)uVar20,auVar68);
                  if (iVar18 != 0) {
                    auVar149._8_4_ = auVar68._8_4_;
                    auVar149._0_8_ = auVar68._0_8_;
                    auVar149._12_4_ = auVar68._12_4_;
                  }
                  uVar29 = movmskps(iVar18,auVar149);
                  uVar20 = CONCAT44((int)(uVar20 >> 0x20),uVar29);
                  lVar25 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                    }
                  }
                  if ((((Geometry *)context->args)->device == (Device *)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar163 = local_10d8[lVar25];
                    fVar57 = local_10c8[lVar25];
                    fVar35 = *(float *)(local_10a8 + lVar25 * 4);
                    fVar59 = *(float *)(local_1098 + lVar25 * 4);
                    fVar109 = *(float *)(local_1088 + lVar25 * 4);
                    (ray->super_RayK<1>).tfar = local_10b8[lVar25];
                    (ray->Ng).field_0.field_0.x = fVar35;
                    (ray->Ng).field_0.field_0.y = fVar59;
                    (ray->Ng).field_0.field_0.z = fVar109;
                    ray->u = fVar163;
                    ray->v = fVar57;
                    ray->primID = (uint)local_1164;
                    ray->geomID = uVar8;
                    pRVar12 = context->user;
                    ray->instID[0] = pRVar12->instID[0];
                    ray->instPrimID[0] = pRVar12->instPrimID[0];
                  }
                  else {
                    local_1228 = (Geometry *)context->args;
                    local_1248 = (undefined1  [8])context->user;
                    local_11e8 = uVar21;
                    _local_1208 = auVar119;
                    aStack_121c._4_8_ = uVar31;
                    local_1048._0_4_ = local_1164;
                    _local_1038 = auVar154;
                    do {
                      local_116c = local_10d8[lVar25];
                      local_1168 = local_10c8[lVar25];
                      local_11f8._0_4_ = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = local_10b8[lVar25];
                      local_1178 = *(float *)(local_10a8 + lVar25 * 4);
                      local_1174 = *(undefined4 *)(local_1098 + lVar25 * 4);
                      local_1170 = *(undefined4 *)(local_1088 + lVar25 * 4);
                      local_1160 = (int)uVar21;
                      local_115c = *(undefined4 *)local_1248;
                      local_1158 = *(undefined4 *)((long)local_1248 + 4);
                      local_124c = (undefined1  [4])0xffffffff;
                      local_11c8.valid = (int *)local_124c;
                      local_11c8.geometryUserPtr = pGVar11->userPtr;
                      local_11c8.context = (RTCRayQueryContext *)local_1248;
                      local_11c8.ray = (RTCRayN *)ray;
                      local_11c8.hit = (RTCHitN *)&local_1178;
                      local_11c8.N = 1;
                      if ((pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         (pGVar27 = pGVar11, (*pGVar11->intersectionFilterN)(&local_11c8),
                         uVar31 = aStack_121c._4_8_, uVar21 = local_11e8, auVar119 = _local_1208,
                         (((RayK<1> *)local_11c8.valid)->org).field_0.m128[0] != 0.0)) {
                        if (local_1228->device != (Device *)0x0) {
                          pGVar27 = local_1228;
                          if ((((ulong)(local_1228->super_RefCount)._vptr_RefCount & 2) != 0) ||
                             (pGVar27 = pGVar11, ((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                            (*(code *)local_1228->device)(&local_11c8);
                            uVar31 = aStack_121c._4_8_;
                            uVar21 = local_11e8;
                            auVar119 = _local_1208;
                          }
                          if ((((RayK<1> *)local_11c8.valid)->org).field_0.m128[0] == 0.0)
                          goto LAB_00e87c20;
                        }
                        (((Vec3f *)((long)local_11c8.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_11c8.hit;
                        (((Vec3f *)((long)local_11c8.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_11c8.hit + 4);
                        (((Vec3f *)((long)local_11c8.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_11c8.hit + 8);
                        *(float *)((long)local_11c8.ray + 0x3c) = *(float *)(local_11c8.hit + 0xc);
                        *(float *)((long)local_11c8.ray + 0x40) = *(float *)(local_11c8.hit + 0x10);
                        *(float *)((long)local_11c8.ray + 0x44) = *(float *)(local_11c8.hit + 0x14);
                        *(float *)((long)local_11c8.ray + 0x48) = *(float *)(local_11c8.hit + 0x18);
                        *(float *)((long)local_11c8.ray + 0x4c) = *(float *)(local_11c8.hit + 0x1c);
                        pGVar27 = (Geometry *)(ulong)(uint)*(float *)(local_11c8.hit + 0x20);
                        *(float *)((long)local_11c8.ray + 0x50) = *(float *)(local_11c8.hit + 0x20);
                        pRVar23 = (RayHit *)local_11c8.ray;
                      }
                      else {
LAB_00e87c20:
                        (ray->super_RayK<1>).tfar = (float)local_11f8;
                        pRVar23 = (RayHit *)local_11c8.valid;
                      }
                      *(undefined4 *)(local_11d8 + lVar25 * 4) = 0;
                      fVar163 = (ray->super_RayK<1>).tfar;
                      auVar54._0_4_ = -(uint)(auVar119._0_4_ <= fVar163) & local_11d8._0_4_;
                      auVar54._4_4_ = -(uint)(auVar119._4_4_ <= fVar163) & local_11d8._4_4_;
                      auVar54._8_4_ = -(uint)(auVar119._8_4_ <= fVar163) & local_11d8._8_4_;
                      auVar54._12_4_ = -(uint)(auVar119._12_4_ <= fVar163) & local_11d8._12_4_;
                      local_11d8 = auVar54;
                      iVar18 = movmskps((int)pRVar23,auVar54);
                      if (iVar18 != 0) {
                        auVar153 = blendvps(_DAT_01feb9f0,auVar119,auVar54);
                        auVar99._4_4_ = auVar153._0_4_;
                        auVar99._0_4_ = auVar153._4_4_;
                        auVar99._8_4_ = auVar153._12_4_;
                        auVar99._12_4_ = auVar153._8_4_;
                        auVar154 = minps(auVar99,auVar153);
                        auVar71._0_8_ = auVar154._8_8_;
                        auVar71._8_4_ = auVar154._0_4_;
                        auVar71._12_4_ = auVar154._4_4_;
                        auVar154 = minps(auVar71,auVar154);
                        auVar72._0_8_ =
                             CONCAT44(-(uint)(auVar154._4_4_ == auVar153._4_4_) & auVar54._4_4_,
                                      -(uint)(auVar154._0_4_ == auVar153._0_4_) & auVar54._0_4_);
                        auVar72._8_4_ = -(uint)(auVar154._8_4_ == auVar153._8_4_) & auVar54._8_4_;
                        auVar72._12_4_ =
                             -(uint)(auVar154._12_4_ == auVar153._12_4_) & auVar54._12_4_;
                        iVar24 = movmskps((int)pGVar27,auVar72);
                        if (iVar24 != 0) {
                          auVar54._8_4_ = auVar72._8_4_;
                          auVar54._0_8_ = auVar72._0_8_;
                          auVar54._12_4_ = auVar72._12_4_;
                        }
                        uVar29 = movmskps(iVar24,auVar54);
                        uVar20 = CONCAT44((int)((ulong)pGVar27 >> 0x20),uVar29);
                        lVar25 = 0;
                        if (uVar20 != 0) {
                          for (; (uVar20 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                          }
                        }
                      }
                      local_1164 = (float)local_1048._0_4_;
                    } while ((char)iVar18 != '\0');
                  }
                }
              }
            }
          }
          lVar25 = 0;
          auVar153 = local_f98;
          fVar163 = local_fb8;
          fVar57 = fStack_fb4;
          fVar74 = fStack_fb0;
          fVar114 = fStack_fac;
          fVar162 = local_ff8;
          fVar138 = fStack_ff4;
          fVar181 = fStack_ff0;
          fVar182 = fStack_fec;
          fVar109 = local_1068;
          fVar142 = fStack_1064;
          fVar36 = fStack_1060;
          fVar56 = fStack_105c;
          fVar155 = local_1058;
          fVar58 = fStack_1054;
          fVar133 = fStack_1050;
          fVar55 = fStack_104c;
          fVar158 = local_fa8;
          fVar60 = fStack_fa4;
          fVar73 = fStack_fa0;
          fVar75 = fStack_f9c;
          fVar35 = local_fc8;
          fVar84 = fStack_fc4;
          fVar85 = fStack_fc0;
          fVar86 = fStack_fbc;
          fVar59 = local_fd8;
          fVar100 = fStack_fd4;
          fVar101 = fStack_fd0;
          fVar110 = fStack_fcc;
          fVar161 = local_fe8;
          fVar112 = fStack_fe4;
          fVar113 = fStack_fe0;
          fVar115 = fStack_fdc;
          fVar150 = local_1008;
          fVar120 = fStack_1004;
          fVar121 = fStack_1000;
          fVar122 = fStack_ffc;
        }
        else {
          local_1230 = uVar21 & 0xfffffffffffffff0;
          lVar25 = *(long *)(local_1230 + 0x30 + (ulong)*(uint *)(local_1230 + 0x2c));
        }
        fVar132 = (ray->super_RayK<1>).tfar;
        auVar175._4_4_ = fVar132;
        auVar175._0_4_ = fVar132;
        auVar175._8_4_ = fVar132;
        auVar175._12_4_ = fVar132;
        if (lVar25 != 0) {
          *(long *)*(undefined1 (*) [16])uVar31 = lVar25;
          *(undefined4 *)((long)*(undefined1 (*) [16])uVar31 + 8) = 0;
          uVar31 = uVar31 + 0x10;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }